

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O3

void anon_unknown.dwarf_145626d::ListDependencies
               (cmDependInformation *info,FILE *fout,
               set<const_(anonymous_namespace)::cmDependInformation_*,_std::less<const_(anonymous_namespace)::cmDependInformation_*>,_std::allocator<const_(anonymous_namespace)::cmDependInformation_*>_>
               *visited)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  cmDependInformation *pcVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  bool bVar11;
  _Alloc_node __an;
  string tmp;
  long *local_78 [2];
  long local_68 [2];
  _Rb_tree_node_base *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  p_Var1 = &(visited->_M_t)._M_impl.super__Rb_tree_header;
  p_Var9 = (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var8 = &p_Var1->_M_header;
  if (p_Var9 == (_Base_ptr)0x0) {
LAB_003a8f4e:
    if (p_Var8 != (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
      lVar5 = std::_Rb_tree_decrement(p_Var8);
      pcVar6 = *(cmDependInformation **)(lVar5 + 0x20);
      goto LAB_003a8f65;
    }
  }
  else {
    do {
      p_Var8 = p_Var9;
      pcVar6 = *(cmDependInformation **)(p_Var8 + 1);
      p_Var9 = (&p_Var8->_M_left)[pcVar6 <= info];
    } while ((&p_Var8->_M_left)[pcVar6 <= info] != (_Base_ptr)0x0);
    if (info < pcVar6) goto LAB_003a8f4e;
LAB_003a8f65:
    if (info <= pcVar6) goto LAB_003a8faa;
  }
  if (p_Var1 == (_Rb_tree_header *)p_Var8) {
    bVar11 = true;
  }
  else {
    bVar11 = info < *(cmDependInformation **)(p_Var8 + 1);
  }
  p_Var7 = (_Rb_tree_node_base *)operator_new(0x28);
  *(cmDependInformation **)(p_Var7 + 1) = info;
  std::_Rb_tree_insert_and_rebalance(bVar11,p_Var7,p_Var8,&p_Var1->_M_header);
  psVar2 = &(visited->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  *psVar2 = *psVar2 + 1;
LAB_003a8faa:
  p_Var9 = (info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58 = &(info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var9 != local_58) {
    do {
      pcVar6 = *(cmDependInformation **)(p_Var9 + 1);
      p_Var8 = (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 = &p_Var1->_M_header;
      if (p_Var8 == (_Base_ptr)0x0) {
LAB_003a9000:
        if ((info->FullPath)._M_string_length != 0) {
          local_78[0] = local_68;
          pcVar3 = (pcVar6->FullPath)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,pcVar3,pcVar3 + (pcVar6->FullPath)._M_string_length);
          lVar5 = std::__cxx11::string::rfind((char)(string *)local_78,0x2e);
          if (lVar5 != -1) {
            std::__cxx11::string::substr((ulong)local_50,(ulong)local_78);
            iVar4 = std::__cxx11::string::compare((char *)local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            if (iVar4 != 0) {
              std::__cxx11::string::substr((ulong)local_50,(ulong)local_78);
              std::__cxx11::string::operator=((string *)local_78,(string *)local_50);
              if (local_50[0] != local_40) {
                operator_delete(local_50[0],local_40[0] + 1);
              }
              fprintf((FILE *)fout,"%s\n",(pcVar6->FullPath)._M_dataplus._M_p);
            }
          }
          if (local_78[0] != local_68) {
            operator_delete(local_78[0],local_68[0] + 1);
          }
        }
        ListDependencies(pcVar6,fout,visited);
      }
      else {
        do {
          if (*(cmDependInformation **)(p_Var8 + 1) >= pcVar6) {
            p_Var10 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[*(cmDependInformation **)(p_Var8 + 1) < pcVar6];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var10 == p_Var1) ||
           (pcVar6 < (cmDependInformation *)((_Rb_tree_header *)p_Var10)->_M_node_count))
        goto LAB_003a9000;
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_58);
  }
  return;
}

Assistant:

void ListDependencies(cmDependInformation const* info, FILE* fout,
                      std::set<cmDependInformation const*>* visited)
{
  // add info to the visited set
  visited->insert(info);
  // now recurse with info's dependencies
  for (cmDependInformation* d : info->DependencySet) {
    if (visited->find(d) == visited->end()) {
      if (!info->FullPath.empty()) {
        std::string tmp = d->FullPath;
        std::string::size_type pos = tmp.rfind('.');
        if (pos != std::string::npos && (tmp.substr(pos) != ".h")) {
          tmp = tmp.substr(0, pos);
          fprintf(fout, "%s\n", d->FullPath.c_str());
        }
      }
      ListDependencies(d, fout, visited);
    }
  }
}